

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O1

void __thiscall Sparse_matrix_Apply_to_vector(void *this,double *vector,double *newVector)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar1 = *this;
  if ((ulong)uVar1 != 0) {
    lVar4 = *(long *)((long)this + 8);
    lVar5 = *(long *)((long)this + 0x10);
    uVar6 = 0;
    do {
      newVector[uVar6] = *(double *)(lVar5 + uVar6 * 8) * vector[uVar6];
      uVar2 = *(uint *)(lVar4 + uVar6 * 4);
      uVar7 = (ulong)uVar2;
      uVar3 = *(uint *)(lVar4 + 4 + uVar6 * 4);
      if (uVar2 < uVar3) {
        dVar8 = newVector[uVar6];
        do {
          dVar8 = dVar8 + *(double *)(lVar5 + uVar7 * 8) * vector[*(uint *)(lVar4 + uVar7 * 4)];
          newVector[uVar6] = dVar8;
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar1);
  }
  return;
}

Assistant:

void Sparse_matrix_Apply_to_vector (
    Sparse_matrix const * this,
    double const * vector,
    double * newVector) {

  register unsigned i, ind;
  
  for (i = 0; i < this->size; ++i) {
    newVector[i] = this->elements[i] * vector[i];
    for (ind = this->indices[i]; ind < this->indices[i+1]; ++ind) {
      newVector[i] += this->elements[ind] * vector[this->indices[ind]];
    }
  }
}